

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamGenerator<bool> __thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 in_RSI;
  ParamGenerator<bool> PVar1;
  vector<bool,_std::allocator<bool>_> local_40;
  ValueArray<bool,_bool> *this_local;
  
  this_local = (ValueArray<bool,_bool> *)this;
  ValueArray<bool,bool>::MakeVector<bool,0ul,1ul>(&local_40,in_RSI);
  ValuesIn<std::vector<bool,std::allocator<bool>>>((testing *)this,&local_40);
  std::vector<bool,_std::allocator<bool>_>::~vector(&local_40);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<bool>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<bool>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<bool>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<bool>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(std::make_index_sequence<sizeof...(Ts)>()));
  }